

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O3

int MaskCpuFlags(int enable_flags)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint in_XCR0;
  
  uVar6 = 0;
  piVar1 = (int *)cpuid_basic_info(0);
  lVar2 = cpuid_Version_info(1);
  uVar4 = *(uint *)(lVar2 + 0xc);
  uVar5 = 0;
  if (6 < *piVar1) {
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar6 = *(uint *)(lVar3 + 4);
    uVar5 = *(uint *)(lVar3 + 0xc);
  }
  uVar7 = (uVar4 >> 0xc & 0x180 | uVar4 >> 3 & 0x40 | *(uint *)(lVar2 + 8) >> 0x15 & 0x20) +
          (uVar6 & 0x200) * 4 + 0x10;
  if ((((~uVar4 & 0x1c000000) == 0) && ((~in_XCR0 & 6) == 0)) &&
     (uVar7 = uVar7 | uVar4 >> 0x10 & 0x2000 | uVar4 & 0x1000 | (uVar6 & 0x20) << 5 | 0x200,
     (~in_XCR0 & 0xe0) == 0)) {
    uVar7 = uVar7 | (uVar5 & 0x4100) << 6 |
                    (uVar5 & 0x1000) << 7 |
                    (uVar5 & 0x40) << 0xc | (uVar5 & 2) << 0x10 | uVar6 >> 0xf & 0x18000;
  }
  cpu_info_ = (uVar7 | 1) & enable_flags;
  return cpu_info_;
}

Assistant:

LIBYUV_API
int MaskCpuFlags(int enable_flags) {
  int cpu_info = GetCpuFlags() & enable_flags;
  SetCpuFlags(cpu_info);
  return cpu_info;
}